

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# etw.cpp
# Opt level: O1

void writeEtw(QFile *file,Provider *provider)

{
  Tracepoint *pTVar1;
  uint i;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  ushort uVar6;
  int *piVar7;
  uint i_00;
  long lVar8;
  qsizetype qVar9;
  undefined4 i_01;
  undefined1 auVar10 [8];
  Data *pDVar11;
  undefined8 uVar12;
  QTextStream *pQVar13;
  char *pcVar14;
  TraceEnum *pTVar15;
  Field *pFVar16;
  uint i_02;
  undefined8 uVar17;
  size_t sVar18;
  long extraout_RDX;
  long extraout_RDX_00;
  long extraout_RDX_01;
  long extraout_RDX_02;
  TraceFlags *flag;
  TraceFlags *name;
  EnumValue *l;
  TraceEnum *name_00;
  EnumValue *args;
  TraceFlags *pTVar19;
  undefined1 **ppuVar20;
  size_t sVar21;
  ulong uVar22;
  EnumValue *v;
  long lVar23;
  quint64 qVar24;
  EnumValue *pEVar25;
  long lVar26;
  FlagValue *pFVar27;
  FlagValue *pFVar28;
  Field *pFVar29;
  uint uVar30;
  FlagValue *v_2;
  ulong uVar31;
  size_t sVar32;
  long lVar33;
  EnumValue *pEVar34;
  Tracepoint *string;
  QString *pQVar35;
  int iVar36;
  EnumValue *v_1;
  char16_t *pcVar37;
  long in_FS_OFFSET;
  QAnyStringView a;
  QAnyStringView a_00;
  QAnyStringView a_01;
  QTextStream stream;
  QString guid;
  QTextStream stream_1;
  QString local_198;
  QTextStream local_178;
  QString local_170;
  QString local_158;
  QString local_138;
  QString local_118;
  undefined1 local_f8 [8];
  undefined8 uStack_f0;
  qsizetype local_e8;
  quint64 qStack_e0;
  undefined1 *local_d8;
  long lStack_d0;
  undefined1 *local_c8;
  undefined1 *puStack_c0;
  undefined1 *local_b8;
  undefined1 *puStack_b0;
  undefined1 *local_a8;
  undefined8 uStack_a0;
  QString local_98;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_178.d_ptr._M_t.
  super___uniq_ptr_impl<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>._M_t.
  super__Tuple_impl<0UL,_QTextStreamPrivate_*,_std::default_delete<QTextStreamPrivate>_>.
  super__Head_base<0UL,_QTextStreamPrivate_*,_false>._M_head_impl =
       (unique_ptr<QTextStreamPrivate,_std::default_delete<QTextStreamPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream(&local_178,(QIODevice *)file);
  local_198.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_198.d.d._0_4_ = 0xaaaaaaaa;
  local_198.d.d._4_4_ = 0xaaaaaaaa;
  local_198.d.ptr._0_4_ = 0xaaaaaaaa;
  local_198.d.ptr._4_4_ = 0xaaaaaaaa;
  (*(file->super_QFileDevice).super_QIODevice._vptr_QIODevice[0x13])((QString *)local_f8,file);
  QFileInfo::QFileInfo((QFileInfo *)&local_98,(QString *)local_f8);
  QFileInfo::fileName(&local_198,(QFileInfo *)&local_98);
  QFileInfo::~QFileInfo((QFileInfo *)&local_98);
  if (local_f8 != (undefined1  [8])0x0) {
    LOCK();
    (((QBasicAtomicInt *)local_f8)->_q_value).super___atomic_base<int>._M_i =
         (((QBasicAtomicInt *)local_f8)->_q_value).super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((((QBasicAtomicInt *)local_f8)->_q_value).super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
    }
  }
  writeCommonPrologue(&local_178);
  local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  uStack_f0 = "_provider";
  local_e8 = 9;
  local_f8 = (undefined1  [8])provider;
  QStringBuilder<const_QString_&,_QLatin1StringView>::convertTo<QString>
            (&local_118,(QStringBuilder<const_QString_&,_QLatin1StringView> *)local_f8);
  local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  includeGuard(&local_138,&local_198);
  local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QString::toLocal8Bit_helper
            ((QByteArray *)&local_170,(QChar *)(provider->name).d.ptr,(provider->name).d.size);
  qVar9 = local_170.d.size;
  pcVar37 = local_170.d.ptr;
  local_a8 = &DAT_aaaaaaaaaaaaaaaa;
  uStack_a0 = &DAT_aaaaaaaaaaaaaaaa;
  local_b8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_b0 = &DAT_aaaaaaaaaaaaaaaa;
  local_c8 = &DAT_aaaaaaaaaaaaaaaa;
  puStack_c0 = &DAT_aaaaaaaaaaaaaaaa;
  local_f8 = (undefined1  [8])0xefcdab8967452301;
  uStack_f0 = (char *)0x1032547698badcfe;
  local_e8 = -0x555555553c2d1e10;
  qVar24 = local_170.d.size + 0x10;
  local_d8 = (undefined1 *)0x0;
  lStack_d0 = 0;
  qStack_e0 = qVar24;
  if ((ulong)local_170.d.size < 0x30) {
    uVar17 = 0x30;
    ppuVar20 = &local_c8;
    uVar31 = local_170.d.size;
  }
  else {
    local_c8 = *(undefined1 **)local_170.d.ptr;
    puStack_c0 = *(undefined1 **)(local_170.d.ptr + 4);
    local_b8 = *(undefined1 **)(local_170.d.ptr + 8);
    puStack_b0 = *(undefined1 **)(local_170.d.ptr + 0xc);
    local_a8 = *(undefined1 **)(local_170.d.ptr + 0x10);
    uStack_a0 = *(undefined1 **)(local_170.d.ptr + 0x14);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    lVar33 = qVar9 - (ulong)((uint)qVar24 & 0x3f);
    lVar23 = 0x30;
    if (0x30 < lVar33) {
      do {
        sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)pcVar37 + lVar23));
        lVar23 = lVar23 + 0x40;
      } while (lVar23 < lVar33);
    }
    pcVar37 = (char16_t *)((long)pcVar37 + lVar23);
    uVar31 = qVar9 - lVar23;
    uVar17 = 0x40;
    ppuVar20 = &local_d8;
  }
  __memcpy_chk(ppuVar20,pcVar37,uVar31,uVar17);
  uVar31 = qStack_e0 * 8;
  local_58.d.d = (Data *)(uVar31 >> 0x38 | (uVar31 & 0xff000000000000) >> 0x28 |
                          (uVar31 & 0xff0000000000) >> 0x18 | (uVar31 & 0xff00000000) >> 8 |
                          (uVar31 & 0xff000000) << 8 | (uVar31 & 0xff0000) << 0x18 |
                          (uVar31 & 0xff00) << 0x28 | qStack_e0 << 0x3b);
  uVar30 = (uint)qStack_e0;
  uVar31 = (ulong)(uVar30 & 0x3f);
  qStack_e0 = qStack_e0 + 1;
  if (uVar31 == 0x3f) {
    memcpy((void *)((long)&uStack_a0 + 7),anon_var_dwarf_2c7,1);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    __memcpy_chk(&local_d8,anon_var_dwarf_2c7 + 1,0,0x40);
  }
  else {
    *(undefined1 *)((long)&local_d8 + uVar31) = 0x80;
  }
  local_98.d.d = (Data *)0x0;
  local_98.d.ptr = (char16_t *)0x0;
  local_98.d.size = 0;
  uStack_80 = 0;
  local_78 = 0;
  uStack_70 = 0;
  local_68 = 0;
  uStack_60 = 0;
  uVar30 = uVar30 & 0x3f;
  uVar31 = (ulong)((uint)qStack_e0 & 0x3f);
  if (uVar30 < 0x38) {
    uVar22 = (ulong)(0x37 - uVar30);
    qStack_e0 = qStack_e0 + uVar22;
    if (uVar31 + uVar22 < 0x40) {
      memcpy((uchar *)((long)&local_d8 + uVar31),&local_98,uVar22);
      goto LAB_00106e51;
    }
    sVar32 = -uVar31 + 0x40;
    memcpy((uchar *)((long)&local_d8 + uVar31),&local_98,sVar32);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    if ((long)sVar32 < (long)(uVar22 - ((uint)(uVar31 + uVar22) & 0x3f))) {
      sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)&local_58 + -uVar31));
      sVar32 = 0x80 - uVar31;
    }
    lVar33 = uVar22 - sVar32;
  }
  else {
    uVar22 = (ulong)(uVar30 ^ 0x3f);
    qStack_e0 = qStack_e0 + uVar22;
    if (uVar31 + uVar22 < 0x40) {
      memcpy((uchar *)((long)&local_d8 + uVar31),&local_98,uVar22);
    }
    else {
      sVar32 = -uVar31 + 0x40;
      memcpy((uchar *)((long)&local_d8 + uVar31),&local_98,sVar32);
      sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
      if ((long)sVar32 < (long)(uVar22 - ((uint)(uVar31 + uVar22) & 0x3f))) {
        sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)&local_58 + -uVar31));
        sVar32 = 0x80 - uVar31;
      }
      __memcpy_chk(&local_d8,(long)&local_98.d.d + sVar32,uVar22 - sVar32,0x40);
    }
    uVar31 = (ulong)((uint)qStack_e0 & 0x3f);
    qVar24 = qStack_e0 + 0x38;
    qStack_e0 = qVar24;
    if (uVar31 < 8) {
      *(undefined8 *)((long)&local_a8 + uVar31) = local_68;
      uVar12 = uStack_70;
      uVar17 = uStack_80;
      qVar9 = local_98.d.size;
      pcVar37 = local_98.d.ptr;
      pDVar11 = local_98.d.d;
      *(undefined8 *)((long)&local_b8 + uVar31) = local_78;
      *(undefined8 *)((long)&puStack_b0 + uVar31) = uVar12;
      *(qsizetype *)((long)&local_c8 + uVar31) = qVar9;
      *(undefined8 *)((long)&puStack_c0 + uVar31) = uVar17;
      *(Data **)((long)&local_d8 + uVar31) = pDVar11;
      *(char16_t **)((long)&lStack_d0 + uVar31) = pcVar37;
      goto LAB_00106e51;
    }
    sVar32 = -uVar31 + 0x40;
    memcpy((uchar *)((long)&local_d8 + uVar31),&local_98,sVar32);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    if ((long)sVar32 < (long)(0x38 - (ulong)((uint)qVar24 & 0x3f))) {
      sha1ProcessChunk((Sha1State *)local_f8,(uchar *)((long)&local_58 + -uVar31));
      sVar32 = 0x80 - uVar31;
    }
    lVar33 = 0x38 - sVar32;
  }
  __memcpy_chk(&local_d8,(long)&local_98.d.d + sVar32,lVar33,0x40);
LAB_00106e51:
  uVar31 = (ulong)((uint)qStack_e0 & 0x3f);
  qVar24 = qStack_e0 + 8;
  if (uVar31 < 0x38) {
    *(Data **)((long)&local_d8 + uVar31) = local_58.d.d;
  }
  else {
    sVar32 = -uVar31 + 0x40;
    qStack_e0 = qVar24;
    memcpy((uchar *)((long)&local_d8 + uVar31),&local_58,sVar32);
    sha1ProcessChunk((Sha1State *)local_f8,(uchar *)&local_d8);
    if ((long)sVar32 < (long)(8 - (ulong)((uint)qVar24 & 0x3f))) {
      sha1ProcessChunk((Sha1State *)local_f8,&stack0xffffffffffffffe8 + -uVar31);
      sVar32 = 0x80 - uVar31;
    }
    __memcpy_chk(&local_d8,(long)&local_58.d.d + sVar32,8 - sVar32,0x40);
  }
  auVar10 = local_f8;
  local_a8 = (undefined1 *)0x0;
  uStack_a0._0_1_ = '\0';
  uStack_a0._1_1_ = '\0';
  uStack_a0._2_1_ = '\0';
  uStack_a0._3_1_ = '\0';
  uStack_a0._4_1_ = '\0';
  uStack_a0._5_1_ = '\0';
  uStack_a0._6_1_ = '\0';
  uStack_a0._7_1_ = '\0';
  local_b8 = (undefined1 *)0x0;
  puStack_b0 = (undefined1 *)0x0;
  local_c8 = (undefined1 *)0x0;
  puStack_c0 = (undefined1 *)0x0;
  local_d8 = (undefined1 *)0x0;
  lStack_d0 = 0;
  qStack_e0 = 0;
  i_01 = local_f8._0_4_;
  uVar6 = local_f8._5_2_;
  iVar36 = local_f8._4_4_ << 0x18;
  uVar30 = (uint)uStack_f0 >> 0x18;
  uVar2 = (uint)uStack_f0 & 0xff0000;
  uVar4 = (uint)uStack_f0 & 0xff00;
  i_02 = (uint)uStack_f0 & 0xff;
  i = uStack_f0._4_4_ >> 0x18;
  uVar3 = uStack_f0._4_4_ & 0xff0000;
  uVar5 = uStack_f0._4_4_ & 0xff00;
  i_00 = uStack_f0._4_4_ & 0xff;
  local_158.d.d = (Data *)0x0;
  local_158.d.ptr = (char16_t *)0x0;
  local_158.d.size = 0;
  local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  QTextStream::QTextStream((QTextStream *)&local_98,&local_158,(OpenMode)0x3);
  Qt::hex((QTextStream *)&local_98);
  Qt::showbase((QTextStream *)&local_98);
  pQVar13 = QTextStream::operator<<((QTextStream *)&local_98,"(");
  pQVar13 = QTextStream::operator<<(pQVar13,i_01);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,auVar10._6_2_);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<
                      (pQVar13,(uVar6 & 0xf | 0x50) << 8 | (ushort)((uint)iVar36 >> 0x18));
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,uVar30 & 0x3f | 0x80);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,uVar2 >> 0x10);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,(uVar4 << 8) >> 0x10);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,i_02);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,i);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,uVar3 >> 0x10);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,(uVar5 << 8) >> 0x10);
  pQVar13 = QTextStream::operator<<(pQVar13,", ");
  pQVar13 = QTextStream::operator<<(pQVar13,i_00);
  QTextStream::operator<<(pQVar13,")");
  QTextStream::~QTextStream((QTextStream *)&local_98);
  if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,1,0x10);
    }
  }
  pQVar13 = QTextStream::operator<<(&local_178,"#ifndef ");
  pQVar13 = QTextStream::operator<<(pQVar13,&local_138);
  pQVar13 = QTextStream::operator<<(pQVar13,"\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"#define ");
  pQVar13 = QTextStream::operator<<(pQVar13,&local_138);
  pQVar13 = QTextStream::operator<<(pQVar13,"\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"#include <qt_windows.h>\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"#include <TraceLoggingProvider.h>\n");
  QTextStream::operator<<(pQVar13,"\n");
  QTextStream::operator<<
            (&local_178,
             "#undef _TlgPragmaUtf8Begin\n#undef _TlgPragmaUtf8End\n#define _TlgPragmaUtf8Begin\n#define _TlgPragmaUtf8End\n"
            );
  QTextStream::operator<<(&local_178,"\n");
  pcVar14 = qtHeaders();
  QTextStream::operator<<(&local_178,pcVar14);
  QTextStream::operator<<(&local_178,"\n");
  if ((provider->prefixText).d.size != 0) {
    local_98.d.d = (Data *)CONCAT62(local_98.d.d._2_6_,10);
    QtPrivate::QStringList_join((QString *)local_f8,&provider->prefixText,(QChar *)&local_98,1);
    pQVar13 = QTextStream::operator<<(&local_178,(QString *)local_f8);
    QTextStream::operator<<(pQVar13,"\n\n");
    if (local_f8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_f8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
      }
    }
  }
  pQVar13 = QTextStream::operator<<(&local_178,"#ifdef TRACEPOINT_DEFINE\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"TRACELOGGING_DEFINE_PROVIDER(");
  pQVar13 = QTextStream::operator<<(pQVar13,&local_118);
  pQVar13 = QTextStream::operator<<(pQVar13,", \"");
  pQVar13 = QTextStream::operator<<(pQVar13,&provider->name);
  pQVar13 = QTextStream::operator<<(pQVar13,"\", ");
  pQVar13 = QTextStream::operator<<(pQVar13,&local_158);
  QTextStream::operator<<(pQVar13,");\n\n");
  pQVar13 = QTextStream::operator<<(&local_178,"static inline void registerProvider()\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"{\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"    TraceLoggingRegister(");
  pQVar13 = QTextStream::operator<<(pQVar13,&local_118);
  pQVar13 = QTextStream::operator<<(pQVar13,");\n");
  QTextStream::operator<<(pQVar13,"}\n\n");
  pQVar13 = QTextStream::operator<<(&local_178,"static inline void unregisterProvider()\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"{\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"    TraceLoggingUnregister(");
  pQVar13 = QTextStream::operator<<(pQVar13,&local_118);
  pQVar13 = QTextStream::operator<<(pQVar13,");\n");
  QTextStream::operator<<(pQVar13,"}\n");
  pQVar13 = QTextStream::operator<<(&local_178,"Q_CONSTRUCTOR_FUNCTION(registerProvider)\n");
  QTextStream::operator<<(pQVar13,"Q_DESTRUCTOR_FUNCTION(unregisterProvider)\n\n");
  pQVar13 = QTextStream::operator<<(&local_178,"#else\n");
  pQVar13 = QTextStream::operator<<(pQVar13,"TRACELOGGING_DECLARE_PROVIDER(");
  pQVar13 = QTextStream::operator<<(pQVar13,&local_118);
  pQVar13 = QTextStream::operator<<(pQVar13,");\n");
  QTextStream::operator<<(pQVar13,"#endif // TRACEPOINT_DEFINE\n\n");
  if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
    }
  }
  if ((provider->tracepoints).d.size != 0) {
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    local_98.d.d = (Data *)0x0;
    local_98.d.ptr = L"TP_%1_PROVIDER";
    local_98.d.size = 0xe;
    sVar18 = (provider->name).d.size * 4 + 2;
    a.m_size = sVar18;
    a.field_0.m_data_utf16 = (provider->name).d.ptr;
    QString::arg_impl((QString *)local_f8,&local_98,a,0,(QChar)0x20);
    QString::toUpper_helper(&local_58,(QString *)local_f8);
    if (local_f8 != (undefined1  [8])0x0) {
      LOCK();
      *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
      UNLOCK();
      if (*(int *)&(((QString *)local_f8)->d).d == 0) {
        QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
      }
    }
    if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
      }
    }
    pQVar13 = QTextStream::operator<<(&local_178,"#if !defined(");
    pQVar13 = QTextStream::operator<<(pQVar13,&local_58);
    pQVar13 = QTextStream::operator<<(pQVar13,") && !defined(TRACEPOINT_DEFINE)\n");
    pQVar13 = QTextStream::operator<<(pQVar13,"#define ");
    pQVar13 = QTextStream::operator<<(pQVar13,&local_58);
    pQVar13 = QTextStream::operator<<(pQVar13,"\n");
    pQVar13 = QTextStream::operator<<(pQVar13,"QT_BEGIN_NAMESPACE\n");
    QTextStream::operator<<(pQVar13,"namespace QtPrivate {\n");
    lVar33 = (provider->enumerations).d.size;
    if (lVar33 != 0) {
      name_00 = (provider->enumerations).d.ptr;
      pTVar15 = name_00 + lVar33;
      do {
        pQVar13 = QTextStream::operator<<(&local_178,"inline QString trace_convert_");
        typeToTypeName((QString *)local_f8,&name_00->name);
        pQVar13 = QTextStream::operator<<(pQVar13,(QString *)local_f8);
        pQVar13 = QTextStream::operator<<(pQVar13,"(");
        pQVar13 = QTextStream::operator<<(pQVar13,&name_00->name);
        QTextStream::operator<<(pQVar13," val)\n");
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
          }
        }
        QTextStream::operator<<(&local_178,"{\n");
        lVar33 = (name_00->values).d.size;
        if (lVar33 != 0) {
          pEVar25 = (name_00->values).d.ptr;
          lVar33 = lVar33 << 5;
          do {
            if (pEVar25->range != 0) {
              pQVar13 = QTextStream::operator<<(&local_178,"    if (val >= ");
              pQVar13 = QTextStream::operator<<(pQVar13,pEVar25->value);
              pQVar13 = QTextStream::operator<<(pQVar13," && val <= ");
              pQVar13 = QTextStream::operator<<(pQVar13,pEVar25->range);
              pQVar13 = QTextStream::operator<<(pQVar13,")\n");
              pQVar13 = QTextStream::operator<<(pQVar13,"        return QStringLiteral(\"");
              pQVar13 = QTextStream::operator<<(pQVar13,&pEVar25->name);
              pQVar13 = QTextStream::operator<<(pQVar13," + \") + QString::number((int)val - ");
              pQVar13 = QTextStream::operator<<(pQVar13,pEVar25->value);
              QTextStream::operator<<(pQVar13,");\n");
            }
            pEVar25 = pEVar25 + 1;
            lVar33 = lVar33 + -0x20;
          } while (lVar33 != 0);
        }
        QTextStream::operator<<(&local_178,"\n    QString ret;\n    switch (val) {\n");
        local_98.d.d = (Data *)0x0;
        local_98.d.ptr = (char16_t *)0x0;
        local_98.d.size = 0;
        lVar33 = (name_00->values).d.size;
        if (lVar33 != 0) {
          pEVar25 = (name_00->values).d.ptr;
          pEVar34 = pEVar25 + lVar33;
          do {
            if (pEVar25->range == 0) {
              if ((undefined1 *)local_98.d.size == (undefined1 *)0x0) {
LAB_001077c4:
                sVar18 = 0xffffffffffffffff;
              }
              else {
                sVar21 = 0xfffffffffffffffc;
                do {
                  lVar33 = local_98.d.size * -4 + sVar21;
                  if (lVar33 == -4) goto LAB_001077be;
                  sVar18 = sVar21 + 4;
                  lVar23 = sVar21 + 4;
                  sVar21 = sVar18;
                } while (*(int *)((long)local_98.d.ptr + lVar23) != pEVar25->value);
                sVar18 = (long)sVar18 >> 2;
LAB_001077be:
                if (lVar33 == -4) goto LAB_001077c4;
              }
              if (sVar18 == 0xffffffffffffffff) {
                pQVar13 = QTextStream::operator<<(&local_178,"    case ");
                pQVar13 = QTextStream::operator<<(pQVar13,pEVar25->value);
                pQVar13 = QTextStream::operator<<(pQVar13,": ret = QStringLiteral(\"");
                iVar36 = pEVar25->value;
                local_f8 = (undefined1  [8])0x0;
                uStack_f0 = (char *)0x0;
                local_e8 = 0;
                lVar33 = (name_00->values).d.size;
                if (lVar33 != 0) {
                  args = (name_00->values).d.ptr;
                  lVar33 = lVar33 << 5;
                  do {
                    if (args->value == iVar36) {
                      QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                                ((QMovableArrayOps<QString> *)local_f8,local_e8,&args->name);
                      QList<QString>::end((QList<QString> *)local_f8);
                    }
                    args = args + 1;
                    lVar33 = lVar33 + -0x20;
                  } while (lVar33 != 0);
                }
                local_138.d.d = (Data *)CONCAT62(local_138.d.d._2_6_,0x5f);
                sVar18 = 1;
                QtPrivate::QStringList_join
                          (&local_118,(QStringList *)local_f8,(QChar *)&local_138,1);
                QArrayDataPointer<QString>::~QArrayDataPointer
                          ((QArrayDataPointer<QString> *)local_f8);
                pQVar13 = QTextStream::operator<<(pQVar13,&local_118);
                QTextStream::operator<<(pQVar13,"\"); break;\n");
                if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
                  LOCK();
                  ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                       ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                       _M_i + -1;
                  UNLOCK();
                  if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>.
                      _M_i == 0) {
                    QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
                  }
                }
                local_f8._0_4_ = pEVar25->value;
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)&local_98,local_98.d.size,(int *)local_f8);
                QList<int>::end((QList<int> *)&local_98);
              }
            }
            pEVar25 = pEVar25 + 1;
          } while (pEVar25 != pEVar34);
        }
        QTextStream::operator<<(&local_178,"    }\n    return ret;\n}\n");
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,4,0x10);
          }
        }
        name_00 = name_00 + 1;
      } while (name_00 != pTVar15);
    }
    lVar33 = (provider->flags).d.size;
    if (lVar33 != 0) {
      name = (provider->flags).d.ptr;
      pTVar19 = name + lVar33;
      do {
        pQVar13 = QTextStream::operator<<(&local_178,"inline QString trace_convert_");
        typeToTypeName((QString *)local_f8,&name->name);
        pQVar13 = QTextStream::operator<<(pQVar13,(QString *)local_f8);
        pQVar13 = QTextStream::operator<<(pQVar13,"(");
        pQVar13 = QTextStream::operator<<(pQVar13,&name->name);
        QTextStream::operator<<(pQVar13," val)\n");
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
          }
        }
        QTextStream::operator<<(&local_178,"{\n    QString ret;\n");
        lVar23 = (name->values).d.size;
        lVar33 = extraout_RDX;
        if (lVar23 != 0) {
          pFVar27 = (name->values).d.ptr;
          lVar26 = 0;
LAB_00107a38:
          if (*(int *)((long)&pFVar27->value + lVar26) != 0) goto code_r0x00107a40;
          pQVar13 = QTextStream::operator<<
                              (&local_178,"    if (val == 0)\n        return QStringLiteral(\"");
          iVar36 = *(int *)((long)&pFVar27->value + lVar26);
          local_f8 = (undefined1  [8])0x0;
          uStack_f0 = (char *)0x0;
          local_e8 = 0;
          lVar33 = (name->values).d.size;
          if (lVar33 != 0) {
            pFVar27 = (name->values).d.ptr;
            lVar33 = lVar33 << 5;
            do {
              if (pFVar27->value == iVar36) {
                QtPrivate::QMovableArrayOps<QString>::emplace<QString_const&>
                          ((QMovableArrayOps<QString> *)local_f8,local_e8,&pFVar27->name);
                QList<QString>::end((QList<QString> *)local_f8);
              }
              pFVar27 = pFVar27 + 1;
              lVar33 = lVar33 + -0x20;
            } while (lVar33 != 0);
          }
          local_118.d.d = (Data *)CONCAT62(local_118.d.d._2_6_,0x5f);
          QtPrivate::QStringList_join(&local_98,(QStringList *)local_f8,(QChar *)&local_118,1);
          QArrayDataPointer<QString>::~QArrayDataPointer((QArrayDataPointer<QString> *)local_f8);
          pQVar13 = QTextStream::operator<<(pQVar13,&local_98);
          QTextStream::operator<<(pQVar13,"\");\n");
          lVar33 = extraout_RDX_00;
          if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
              lVar33 = extraout_RDX_01;
            }
          }
        }
LAB_00107b35:
        local_f8 = (undefined1  [8])0x0;
        uStack_f0 = (char *)0x0;
        local_e8 = 0;
        lVar23 = (name->values).d.size;
        if (lVar23 != 0) {
          pFVar27 = (name->values).d.ptr;
          pFVar28 = pFVar27 + lVar23;
          do {
            if (pFVar27->value != 0) {
              if (local_e8 == 0) {
LAB_00107bb5:
                lVar33 = -1;
              }
              else {
                lVar23 = -4;
                do {
                  lVar26 = local_e8 * -4 + lVar23;
                  if (lVar26 == -4) goto LAB_00107baf;
                  lVar33 = lVar23 + 4;
                  lVar8 = lVar23 + 4;
                  lVar23 = lVar33;
                } while (*(int *)((long)&(((QString *)uStack_f0)->d).d + lVar8) != pFVar27->value);
                lVar33 = lVar33 >> 2;
LAB_00107baf:
                if (lVar26 == -4) goto LAB_00107bb5;
              }
              if (lVar33 == -1) {
                pQVar13 = QTextStream::operator<<(&local_178,"    if (val & ");
                pQVar13 = QTextStream::operator<<(pQVar13,1 << ((char)pFVar27->value - 1U & 0x1f));
                pQVar13 = QTextStream::operator<<
                                    (pQVar13,
                                     ") { if (ret.length()) ret += QLatin1Char(\'|\'); ret += QStringLiteral(\""
                                    );
                pQVar13 = QTextStream::operator<<(pQVar13,&pFVar27->name);
                QTextStream::operator<<(pQVar13,"\"); }\n");
                local_98.d.d = (Data *)CONCAT44(local_98.d.d._4_4_,pFVar27->value);
                QtPrivate::QPodArrayOps<int>::emplace<int&>
                          ((QPodArrayOps<int> *)local_f8,local_e8,(int *)&local_98);
                QList<int>::end((QList<int> *)local_f8);
                lVar33 = extraout_RDX_02;
              }
            }
            pFVar27 = pFVar27 + 1;
          } while (pFVar27 != pFVar28);
        }
        QTextStream::operator<<(&local_178,"    return ret;\n}\n");
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,4,0x10);
          }
        }
        name = name + 1;
      } while (name != pTVar19);
    }
    lVar33 = (provider->tracepoints).d.size;
    if (lVar33 != 0) {
      string = (provider->tracepoints).d.ptr;
      pTVar1 = string + lVar33;
      do {
        local_98.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_98.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        formatFunctionSignature(&local_98,&string->args);
        local_118.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_118.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        formatParameterList(&local_118,provider,&string->args,&string->fields,ETW);
        local_138.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_138.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        local_170.d.d = (Data *)0x0;
        local_170.d.ptr = L"TP_%1_%2";
        local_170.d.size = 8;
        a_00.m_size = (provider->name).d.size * 4 + 2;
        a_00.field_0.m_data_utf16 = (provider->name).d.ptr;
        QString::arg_impl(&local_158,&local_170,a_00,0,(QChar)0x20);
        a_01.m_size = (string->name).d.size * 4 + 2;
        a_01.field_0.m_data_utf16 = (string->name).d.ptr;
        QString::arg_impl((QString *)local_f8,&local_158,a_01,0,(QChar)0x20);
        QString::toUpper_helper(&local_138,(QString *)local_f8);
        if (local_f8 != (undefined1  [8])0x0) {
          LOCK();
          *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
          UNLOCK();
          if (*(int *)&(((QString *)local_f8)->d).d == 0) {
            QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
          }
        }
        if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_170.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_170.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_170.d.d)->super_QArrayData,2,0x10);
          }
        }
        local_158.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        local_158.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
        uStack_f0 = "_provider";
        local_e8 = 9;
        local_f8 = (undefined1  [8])provider;
        QStringBuilder<const_QString_&,_QLatin1StringView>::convertTo<QString>
                  (&local_158,(QStringBuilder<const_QString_&,_QLatin1StringView> *)local_f8);
        QTextStream::operator<<(&local_178,"\n");
        pQVar13 = QTextStream::operator<<(&local_178,"inline void trace_");
        pQVar13 = QTextStream::operator<<(pQVar13,&string->name);
        pQVar13 = QTextStream::operator<<(pQVar13,"(");
        pQVar13 = QTextStream::operator<<(pQVar13,&local_98);
        pQVar13 = QTextStream::operator<<(pQVar13,")\n");
        QTextStream::operator<<(pQVar13,"{\n");
        lVar33 = (string->fields).d.size;
        if (lVar33 != 0) {
          pQVar35 = &((string->fields).d.ptr)->name;
          lVar33 = lVar33 * 0x58;
          do {
            if (*(int *)((long)(pQVar35 + -2) + 0x10) == 0x10) {
              pQVar13 = QTextStream::operator<<(&local_178,"    const QString ");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,"Str = QDebug::toString(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              QTextStream::operator<<(pQVar13,");\n");
            }
            pQVar35 = (QString *)((long)(pQVar35 + 3) + 0x10);
            lVar33 = lVar33 + -0x58;
          } while (lVar33 != 0);
        }
        pQVar13 = QTextStream::operator<<(&local_178,"    TraceLoggingWrite(");
        pQVar13 = QTextStream::operator<<(pQVar13,&local_158);
        pQVar13 = QTextStream::operator<<(pQVar13,", \"");
        pQVar13 = QTextStream::operator<<(pQVar13,&string->name);
        QTextStream::operator<<(pQVar13,"\"");
        lVar33 = (string->fields).d.size;
        if (lVar33 != 0) {
          pFVar29 = (string->fields).d.ptr;
          pFVar16 = pFVar29 + lVar33;
          do {
            QTextStream::operator<<(&local_178,",\n");
            QTextStream::operator<<(&local_178,"        ");
            pQVar35 = &pFVar29->name;
            if (0 < pFVar29->arrayLen) {
              iVar36 = 0;
              do {
                pQVar13 = QTextStream::operator<<(&local_178,"TraceLoggingValue(");
                pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
                pQVar13 = QTextStream::operator<<(pQVar13,"[");
                pQVar13 = QTextStream::operator<<(pQVar13,iVar36);
                pQVar13 = QTextStream::operator<<(pQVar13,"], \"");
                pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
                pQVar13 = QTextStream::operator<<(pQVar13,"[");
                pQVar13 = QTextStream::operator<<(pQVar13,iVar36);
                QTextStream::operator<<(pQVar13,"]\")");
                iVar36 = iVar36 + 1;
                if (iVar36 < pFVar29->arrayLen) {
                  QTextStream::operator<<(&local_178,",\n        ");
                }
              } while (iVar36 < pFVar29->arrayLen);
              goto LAB_00108330;
            }
            switch(pFVar29->backendType) {
            case Pointer:
              pcVar14 = "TraceLoggingPointer(";
              goto LAB_001082f7;
            case QtString:
              pQVar13 = QTextStream::operator<<
                                  (&local_178,
                                   "TraceLoggingCountedWideString(reinterpret_cast<LPCWSTR>(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,".utf16()), static_cast<ULONG>(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pcVar14 = ".size()), \"";
              break;
            case QtByteArray:
              pQVar13 = QTextStream::operator<<(&local_178,"TraceLoggingBinary(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,".constData(), ");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pcVar14 = ".size(), \"";
              break;
            case QtUrl:
              pQVar13 = QTextStream::operator<<(&local_178,"TraceLoggingValue(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pcVar14 = ".toEncoded().constData(), \"";
              break;
            case QtRect:
            case QtRectF:
              pQVar13 = QTextStream::operator<<(&local_178,"TraceLoggingValue(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,".x(), \"x\"), ");
              pQVar13 = QTextStream::operator<<(pQVar13,"TraceLoggingValue(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,".y(), \"y\"), ");
              goto LAB_001081b3;
            case QtSize:
            case QtSizeF:
              pQVar13 = &local_178;
LAB_001081b3:
              pQVar13 = QTextStream::operator<<(pQVar13,"TraceLoggingValue(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,".width(), \"width\"), ");
              pQVar13 = QTextStream::operator<<(pQVar13,"TraceLoggingValue(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pcVar14 = ".height(), \"height\")";
              goto LAB_0010832b;
            case EnumeratedType:
            case FlagType:
              pQVar13 = QTextStream::operator<<(&local_178,"TraceLoggingString(trace_convert_");
              typeToTypeName((QString *)local_f8,&pFVar29->paramType);
              pQVar13 = QTextStream::operator<<(pQVar13,(QString *)local_f8);
              pQVar13 = QTextStream::operator<<(pQVar13,"(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,").toUtf8().constData(), \"");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              QTextStream::operator<<(pQVar13,"\")");
              if (local_f8 != (undefined1  [8])0x0) {
                LOCK();
                *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
                UNLOCK();
                if (*(int *)&(((QString *)local_f8)->d).d == 0) {
                  QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
                }
              }
              goto LAB_00108330;
            case Unknown:
              pQVar13 = QTextStream::operator<<
                                  (&local_178,
                                   "TraceLoggingCountedWideString(reinterpret_cast<LPCWSTR>(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pQVar13 = QTextStream::operator<<(pQVar13,"Str.utf16()), static_cast<ULONG>(");
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pcVar14 = "Str.size()), \"";
              break;
            default:
              pcVar14 = "TraceLoggingValue(";
LAB_001082f7:
              pQVar13 = QTextStream::operator<<(&local_178,pcVar14);
              pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
              pcVar14 = ", \"";
            }
            pQVar13 = QTextStream::operator<<(pQVar13,pcVar14);
            pQVar13 = QTextStream::operator<<(pQVar13,pQVar35);
            pcVar14 = "\")";
LAB_0010832b:
            QTextStream::operator<<(pQVar13,pcVar14);
LAB_00108330:
            pFVar29 = pFVar29 + 1;
          } while (pFVar29 != pFVar16);
        }
        pQVar13 = QTextStream::operator<<(&local_178,");\n");
        QTextStream::operator<<(pQVar13,"}\n\n");
        pQVar13 = QTextStream::operator<<(&local_178,"inline void do_trace_");
        pQVar13 = QTextStream::operator<<(pQVar13,&string->name);
        pQVar13 = QTextStream::operator<<(pQVar13,"(");
        pQVar13 = QTextStream::operator<<(pQVar13,&local_98);
        pQVar13 = QTextStream::operator<<(pQVar13,")\n");
        pQVar13 = QTextStream::operator<<(pQVar13,"{\n");
        pQVar13 = QTextStream::operator<<(pQVar13,"    trace_");
        pQVar13 = QTextStream::operator<<(pQVar13,&string->name);
        pQVar13 = QTextStream::operator<<(pQVar13,"(");
        pQVar13 = QTextStream::operator<<(pQVar13,&local_118);
        pQVar13 = QTextStream::operator<<(pQVar13,");\n");
        QTextStream::operator<<(pQVar13,"}\n");
        pQVar13 = QTextStream::operator<<(&local_178,"inline bool trace_");
        pQVar13 = QTextStream::operator<<(pQVar13,&string->name);
        pQVar13 = QTextStream::operator<<(pQVar13,"_enabled()\n");
        pQVar13 = QTextStream::operator<<(pQVar13,"{\n");
        pQVar13 = QTextStream::operator<<(pQVar13,"    return TraceLoggingProviderEnabled(");
        pQVar13 = QTextStream::operator<<(pQVar13,&local_158);
        pQVar13 = QTextStream::operator<<(pQVar13,", 0, 0);\n");
        QTextStream::operator<<(pQVar13,"}\n");
        if (&(local_158.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_158.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_158.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_138.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_138.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_138.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_118.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_118.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
          {
            QArrayData::deallocate(&(local_118.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (&(local_98.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_98.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_98.d.d)->super_QArrayData,2,0x10);
          }
        }
        string = string + 1;
      } while (string != pTVar1);
    }
    pQVar13 = QTextStream::operator<<(&local_178,"} // namespace QtPrivate\n");
    pQVar13 = QTextStream::operator<<(pQVar13,"QT_END_NAMESPACE\n");
    pQVar13 = QTextStream::operator<<(pQVar13,"#endif // ");
    pQVar13 = QTextStream::operator<<(pQVar13,&local_58);
    QTextStream::operator<<(pQVar13,"\n\n");
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  pQVar13 = QTextStream::operator<<(&local_178,"\n#endif // ");
  includeGuard((QString *)local_f8,&local_198);
  pQVar13 = QTextStream::operator<<(pQVar13,(QString *)local_f8);
  pQVar13 = QTextStream::operator<<(pQVar13,"\n");
  QTextStream::operator<<(pQVar13,"#include <private/qtrace_p.h>\n");
  if (local_f8 != (undefined1  [8])0x0) {
    LOCK();
    *(int *)&(((QString *)local_f8)->d).d = *(int *)&(((QString *)local_f8)->d).d + -1;
    UNLOCK();
    if (*(int *)&(((QString *)local_f8)->d).d == 0) {
      QArrayData::deallocate((QArrayData *)local_f8,2,0x10);
    }
  }
  piVar7 = (int *)CONCAT44(local_198.d.d._4_4_,local_198.d.d._0_4_);
  if (piVar7 != (int *)0x0) {
    LOCK();
    *piVar7 = *piVar7 + -1;
    UNLOCK();
    if (*piVar7 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(local_198.d.d._4_4_,local_198.d.d._0_4_),2,0x10)
      ;
    }
  }
  QTextStream::~QTextStream(&local_178);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
code_r0x00107a40:
  lVar26 = lVar26 + 0x20;
  if (lVar23 << 5 == lVar26) goto LAB_00107b35;
  goto LAB_00107a38;
}

Assistant:

void writeEtw(QFile &file, const Provider &provider)
{
    QTextStream stream(&file);

    const QString fileName = QFileInfo(file.fileName()).fileName();

    writePrologue(stream, fileName, provider);
    writeTracepoints(stream, provider);
    writeEpilogue(stream, fileName);
}